

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.c
# Opt level: O1

void recompute_shading_normals(mesh *mesh)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  void *pvVar4;
  void *pvVar5;
  long lVar6;
  long lVar7;
  undefined4 *puVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  float *pfVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  pvVar4 = mesh->attrs[1].data;
  pvVar5 = mesh->attrs[2].data;
  lVar7 = 4 - (ulong)(mesh->type == TRI_MESH);
  if (mesh->vertex_count != 0) {
    puVar8 = (undefined4 *)((long)pvVar4 + 8);
    uVar9 = 0;
    do {
      *(undefined8 *)(puVar8 + -2) = 0;
      *puVar8 = 0;
      uVar9 = uVar9 + 1;
      puVar8 = puVar8 + 3;
    } while (uVar9 < mesh->vertex_count);
  }
  if (mesh->primitive_count != 0) {
    lVar10 = 0;
    uVar9 = 0;
    do {
      uVar2 = *(undefined8 *)((long)pvVar5 + uVar9 * 0xc);
      fVar1 = *(float *)((long)pvVar5 + uVar9 * 0xc + 8);
      lVar11 = lVar10;
      lVar12 = lVar7;
      do {
        lVar6 = *(long *)((long)mesh->indices + lVar11);
        uVar3 = *(undefined8 *)((long)pvVar4 + lVar6 * 0xc);
        fVar14 = *(float *)((long)pvVar4 + lVar6 * 0xc + 8);
        *(ulong *)((long)pvVar4 + lVar6 * 0xc) =
             CONCAT44((float)((ulong)uVar3 >> 0x20) + (float)((ulong)uVar2 >> 0x20),
                      (float)uVar3 + (float)uVar2);
        *(float *)((long)pvVar4 + lVar6 * 0xc + 8) = fVar14 + fVar1;
        lVar11 = lVar11 + 8;
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
      uVar9 = uVar9 + 1;
      lVar10 = lVar10 + lVar7 * 8;
    } while (uVar9 < mesh->primitive_count);
  }
  if (mesh->vertex_count != 0) {
    pfVar13 = (float *)((long)pvVar4 + 8);
    uVar9 = 0;
    do {
      fVar15 = (float)*(undefined8 *)(pfVar13 + -2);
      fVar16 = (float)((ulong)*(undefined8 *)(pfVar13 + -2) >> 0x20);
      fVar1 = *pfVar13;
      fVar14 = fVar15 * fVar15 + fVar16 * fVar16 + fVar1 * fVar1;
      if (fVar14 < 0.0) {
        fVar14 = sqrtf(fVar14);
      }
      else {
        fVar14 = SQRT(fVar14);
      }
      fVar14 = 1.0 / fVar14;
      *(ulong *)(pfVar13 + -2) = CONCAT44(fVar16 * fVar14,fVar15 * fVar14);
      *pfVar13 = fVar1 * fVar14;
      uVar9 = uVar9 + 1;
      pfVar13 = pfVar13 + 3;
    } while (uVar9 < mesh->vertex_count);
  }
  return;
}

Assistant:

void recompute_shading_normals(struct mesh* mesh) {
    const struct vec3* geometry_normals = mesh->attrs[ATTR_GEOMETRY_NORMAL].data;
    struct vec3* normals = mesh->attrs[ATTR_SHADING_NORMAL].data;
    size_t index_stride = mesh->type == TRI_MESH ? 3 : 4;
    for (size_t i = 0; i < mesh->vertex_count; ++i)
        normals[i] = const_vec3(0);
    for (size_t i = 0; i < mesh->primitive_count; i++) {
        const struct vec3 geometry_normal = geometry_normals[i];
        for (size_t j = 0; j < index_stride; ++j) {
            size_t k = mesh->indices[i * index_stride + j];
            normals[k] = add_vec3(normals[k], geometry_normal);
        }
    }
    for (size_t i = 0; i < mesh->vertex_count; ++i)
        normals[i] = normalize_vec3(normals[i]);
}